

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressStream_generic
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective flushMode)

{
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  size_t local_e0;
  bool local_c9;
  size_t flushed;
  size_t toFlush;
  size_t sStack_a0;
  uint lastBlock;
  size_t oSize;
  size_t iSize;
  size_t cSize_1;
  void *cDst;
  size_t loaded;
  size_t toLoad;
  size_t cSize;
  void *pvStack_60;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *ip;
  char *iend;
  char *istart;
  ZSTD_EndDirective flushMode_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CStream *zcs_local;
  
  pvVar2 = input->src;
  pcVar7 = (char *)((long)pvVar2 + input->size);
  pvVar3 = output->dst;
  sVar4 = output->size;
  pvStack_60 = (void *)((long)pvVar3 + output->pos);
  bVar5 = true;
  ostart = (char *)((long)pvVar2 + input->pos);
LAB_007224b7:
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (!bVar5) {
            input->pos = (long)ostart - (long)pvVar2;
            output->pos = (long)pvStack_60 - (long)pvVar3;
            if (zcs->frameEnded == 0) {
              zcs_local = (ZSTD_CStream *)ZSTD_nextInputSizeHint(zcs);
            }
            else {
              zcs_local = (ZSTD_CStream *)0x0;
            }
            return (size_t)zcs_local;
          }
          ZVar1 = zcs->streamStage;
          if (ZVar1 == zcss_init) {
            return 0xffffffffffffffc2;
          }
          if (ZVar1 != zcss_load) goto LAB_007224e4;
          if (((flushMode != ZSTD_e_end) ||
              (sVar8 = ZSTD_compressBound((long)pcVar7 - (long)ostart),
              (long)pvVar3 + (sVar4 - (long)pvStack_60) < sVar8)) || (zcs->inBuffPos != 0)) break;
          sVar8 = ZSTD_compressEnd(zcs,pvStack_60,(long)pvVar3 + (sVar4 - (long)pvStack_60),ostart,
                                   (long)pcVar7 - (long)ostart);
          uVar6 = ERR_isError(sVar8);
          if (uVar6 != 0) {
            return sVar8;
          }
          pvStack_60 = (void *)(sVar8 + (long)pvStack_60);
          zcs->frameEnded = 1;
          ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
          bVar5 = false;
          ostart = pcVar7;
        }
        sVar8 = ZSTD_limitCopy(zcs->inBuff + zcs->inBuffPos,zcs->inBuffTarget - zcs->inBuffPos,
                               ostart,(long)pcVar7 - (long)ostart);
        zcs->inBuffPos = sVar8 + zcs->inBuffPos;
        ostart = ostart + sVar8;
        if ((flushMode != ZSTD_e_continue) || (zcs->inBuffTarget <= zcs->inBuffPos)) break;
        bVar5 = false;
      }
      if ((flushMode != ZSTD_e_flush) || (zcs->inBuffPos != zcs->inToCompress)) break;
      bVar5 = false;
    }
    sVar8 = zcs->inBuffPos - zcs->inToCompress;
    sStack_a0 = (long)pvVar3 + (sVar4 - (long)pvStack_60);
    local_c9 = flushMode == ZSTD_e_end && ostart == pcVar7;
    sVar9 = ZSTD_compressBound(sVar8);
    if (sStack_a0 < sVar9) {
      cSize_1 = (size_t)zcs->outBuff;
      sStack_a0 = zcs->outBuffSize;
    }
    else {
      cSize_1 = (size_t)pvStack_60;
    }
    if (local_c9 == 0) {
      local_e0 = ZSTD_compressContinue
                           (zcs,(void *)cSize_1,sStack_a0,zcs->inBuff + zcs->inToCompress,sVar8);
    }
    else {
      local_e0 = ZSTD_compressEnd(zcs,(void *)cSize_1,sStack_a0,zcs->inBuff + zcs->inToCompress,
                                  sVar8);
    }
    uVar6 = ERR_isError(local_e0);
    if (uVar6 != 0) {
      return local_e0;
    }
    zcs->frameEnded = (uint)local_c9;
    zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
    if (zcs->inBuffSize < zcs->inBuffTarget) {
      zcs->inBuffPos = 0;
      zcs->inBuffTarget = zcs->blockSize;
    }
    zcs->inToCompress = zcs->inBuffPos;
    if ((void *)cSize_1 != pvStack_60) break;
    pvStack_60 = (void *)(local_e0 + (long)pvStack_60);
    if (zcs->frameEnded != 0) {
      bVar5 = false;
      ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
    }
  }
  zcs->outBuffContentSize = local_e0;
  zcs->outBuffFlushedSize = 0;
  zcs->streamStage = zcss_flush;
  goto LAB_007228f5;
LAB_007224e4:
  if (ZVar1 == zcss_flush) {
LAB_007228f5:
    sVar8 = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
    sVar9 = ZSTD_limitCopy(pvStack_60,(long)pvVar3 + (sVar4 - (long)pvStack_60),
                           zcs->outBuff + zcs->outBuffFlushedSize,sVar8);
    pvStack_60 = (void *)(sVar9 + (long)pvStack_60);
    zcs->outBuffFlushedSize = sVar9 + zcs->outBuffFlushedSize;
    if (sVar8 == sVar9) {
      zcs->outBuffFlushedSize = 0;
      zcs->outBuffContentSize = 0;
      if (zcs->frameEnded == 0) {
        zcs->streamStage = zcss_load;
      }
      else {
        bVar5 = false;
        ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
      }
    }
    else {
      bVar5 = false;
    }
  }
  goto LAB_007224b7;
}

Assistant:

size_t ZSTD_compressStream_generic(ZSTD_CStream* zcs,
                                   ZSTD_outBuffer* output,
                                   ZSTD_inBuffer* input,
                                   ZSTD_EndDirective const flushMode)
{
    const char* const istart = (const char*)input->src;
    const char* const iend = istart + input->size;
    const char* ip = istart + input->pos;
    char* const ostart = (char*)output->dst;
    char* const oend = ostart + output->size;
    char* op = ostart + output->pos;
    U32 someMoreWork = 1;

    /* check expectations */
    DEBUGLOG(5, "ZSTD_compressStream_generic, flush=%u", (unsigned)flushMode);
    assert(zcs->inBuff != NULL);
    assert(zcs->inBuffSize > 0);
    assert(zcs->outBuff !=  NULL);
    assert(zcs->outBuffSize > 0);
    assert(output->pos <= output->size);
    assert(input->pos <= input->size);

    while (someMoreWork) {
        switch(zcs->streamStage)
        {
        case zcss_init:
            /* call ZSTD_initCStream() first ! */
            return ERROR(init_missing);

        case zcss_load:
            if ( (flushMode == ZSTD_e_end)
              && ((size_t)(oend-op) >= ZSTD_compressBound(iend-ip))  /* enough dstCapacity */
              && (zcs->inBuffPos == 0) ) {
                /* shortcut to compression pass directly into output buffer */
                size_t const cSize = ZSTD_compressEnd(zcs,
                                                op, oend-op, ip, iend-ip);
                DEBUGLOG(4, "ZSTD_compressEnd : cSize=%u", (unsigned)cSize);
                if (ZSTD_isError(cSize)) return cSize;
                ip = iend;
                op += cSize;
                zcs->frameEnded = 1;
                ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                someMoreWork = 0; break;
            }
            /* complete loading into inBuffer */
            {   size_t const toLoad = zcs->inBuffTarget - zcs->inBuffPos;
                size_t const loaded = ZSTD_limitCopy(
                                        zcs->inBuff + zcs->inBuffPos, toLoad,
                                        ip, iend-ip);
                zcs->inBuffPos += loaded;
                ip += loaded;
                if ( (flushMode == ZSTD_e_continue)
                  && (zcs->inBuffPos < zcs->inBuffTarget) ) {
                    /* not enough input to fill full block : stop here */
                    someMoreWork = 0; break;
                }
                if ( (flushMode == ZSTD_e_flush)
                  && (zcs->inBuffPos == zcs->inToCompress) ) {
                    /* empty */
                    someMoreWork = 0; break;
                }
            }
            /* compress current block (note : this stage cannot be stopped in the middle) */
            DEBUGLOG(5, "stream compression stage (flushMode==%u)", flushMode);
            {   void* cDst;
                size_t cSize;
                size_t const iSize = zcs->inBuffPos - zcs->inToCompress;
                size_t oSize = oend-op;
                unsigned const lastBlock = (flushMode == ZSTD_e_end) && (ip==iend);
                if (oSize >= ZSTD_compressBound(iSize))
                    cDst = op;   /* compress into output buffer, to skip flush stage */
                else
                    cDst = zcs->outBuff, oSize = zcs->outBuffSize;
                cSize = lastBlock ?
                        ZSTD_compressEnd(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize) :
                        ZSTD_compressContinue(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize);
                if (ZSTD_isError(cSize)) return cSize;
                zcs->frameEnded = lastBlock;
                /* prepare next block */
                zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
                if (zcs->inBuffTarget > zcs->inBuffSize)
                    zcs->inBuffPos = 0, zcs->inBuffTarget = zcs->blockSize;
                DEBUGLOG(5, "inBuffTarget:%u / inBuffSize:%u",
                         (unsigned)zcs->inBuffTarget, (unsigned)zcs->inBuffSize);
                if (!lastBlock)
                    assert(zcs->inBuffTarget <= zcs->inBuffSize);
                zcs->inToCompress = zcs->inBuffPos;
                if (cDst == op) {  /* no need to flush */
                    op += cSize;
                    if (zcs->frameEnded) {
                        DEBUGLOG(5, "Frame completed directly in outBuffer");
                        someMoreWork = 0;
                        ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    }
                    break;
                }
                zcs->outBuffContentSize = cSize;
                zcs->outBuffFlushedSize = 0;
                zcs->streamStage = zcss_flush; /* pass-through to flush stage */
            }
	    /* fall-through */
        case zcss_flush:
            DEBUGLOG(5, "flush stage");
            {   size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
                size_t const flushed = ZSTD_limitCopy(op, oend-op,
                            zcs->outBuff + zcs->outBuffFlushedSize, toFlush);
                DEBUGLOG(5, "toFlush: %u into %u ==> flushed: %u",
                            (unsigned)toFlush, (unsigned)(oend-op), (unsigned)flushed);
                op += flushed;
                zcs->outBuffFlushedSize += flushed;
                if (toFlush!=flushed) {
                    /* flush not fully completed, presumably because dst is too small */
                    assert(op==oend);
                    someMoreWork = 0;
                    break;
                }
                zcs->outBuffContentSize = zcs->outBuffFlushedSize = 0;
                if (zcs->frameEnded) {
                    DEBUGLOG(5, "Frame completed on flush");
                    someMoreWork = 0;
                    ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    break;
                }
                zcs->streamStage = zcss_load;
                break;
            }

        default: /* impossible */
            assert(0);
        }
    }

    input->pos = ip - istart;
    output->pos = op - ostart;
    if (zcs->frameEnded) return 0;
    return ZSTD_nextInputSizeHint(zcs);
}